

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EstimatorUtilStats.h
# Opt level: O3

void WriteAlgorithmOutput(FILE *f,string *algo_name,Parameters params,EstimatorStats est_stats)

{
  fprintf((FILE *)f,"#--------------------------------------------------------%s\n",
          (algo_name->_M_dataplus)._M_p);
  fprintf((FILE *)f,
          "#Results: Mean Err, Median Err, Max Err, stddev Err (in %%) of simple sampling\n");
  fprintf((FILE *)f,"%.3lf,%.3lf,%.3lf,%.3lf \n\n",params.filename._M_string_length,
          params.filename.field_2._M_allocated_capacity,params.seed_count,
          params.filename.field_2._8_8_);
  fwrite("Query Complexity, Fraction of edges seen, fraction of vertices seen(maximum over all run)\n"
         ,0x5a,1,(FILE *)f);
  fprintf((FILE *)f,"%.6lf,%.6lf,%.6lf\n\n",
          params.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage,
          params.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_finish,
          params.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_start);
  return;
}

Assistant:

void WriteAlgorithmOutput(FILE *f, std::string algo_name, Parameters params,
                          EstimatorStats est_stats) {
    fprintf(f, "#--------------------------------------------------------%s\n", algo_name.c_str());
    fprintf(f, "#Results: Mean Err, Median Err, Max Err, stddev Err (in %%) of simple sampling\n");
    fprintf(f, "%.3lf,%.3lf,%.3lf,%.3lf \n\n", est_stats.mean_error_percentage,
            est_stats.median_error_percentage, est_stats.max_error_percentage,
            est_stats.stddev_error_percentage);
    fprintf(f, "Query Complexity, Fraction of edges seen, fraction of vertices seen(maximum over all run)\n");
    fprintf(f, "%.6lf,%.6lf,%.6lf\n\n", est_stats.query_complexity_max_percentage, est_stats.edges_seen_max_percentage,
            est_stats.vertices_seen_max_percentage);
}